

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O1

void console_logging_error(LogPolicy *lp,char *string)

{
  termios cf;
  
  premsg(&cf);
  fprintf(_stderr,"%s\n",string);
  fflush(_stderr);
  if (stderr_is_a_tty == '\x01') {
    tcsetattr(2,1,(termios *)&cf);
  }
  return;
}

Assistant:

void console_logging_error(LogPolicy *lp, const char *string)
{
    /* Errors setting up logging are considered important, so they're
     * displayed to standard error even when not in verbose mode */
    struct termios cf;
    premsg(&cf);
    fprintf(stderr, "%s\n", string);
    fflush(stderr);
    postmsg(&cf);
}